

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

AnnualTimeZoneRule * __thiscall
icu_63::AnnualTimeZoneRule::operator=(AnnualTimeZoneRule *this,AnnualTimeZoneRule *right)

{
  int iVar1;
  undefined4 extraout_var;
  int in_ECX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  UnicodeString *src;
  void *in_R8;
  
  if (this != right) {
    src = &(right->super_TimeZoneRule).fName;
    UnicodeString::operator=(&(this->super_TimeZoneRule).fName,src);
    (this->super_TimeZoneRule).fRawOffset = (right->super_TimeZoneRule).fRawOffset;
    (this->super_TimeZoneRule).fDSTSavings = (right->super_TimeZoneRule).fDSTSavings;
    __child_stack = extraout_RDX;
    if (this->fDateTimeRule != (DateTimeRule *)0x0) {
      (*(this->fDateTimeRule->super_UObject)._vptr_UObject[1])();
      __child_stack = extraout_RDX_00;
    }
    iVar1 = DateTimeRule::clone(right->fDateTimeRule,(__fn *)src,__child_stack,in_ECX,in_R8);
    this->fDateTimeRule = (DateTimeRule *)CONCAT44(extraout_var,iVar1);
    this->fStartYear = right->fStartYear;
    this->fEndYear = right->fEndYear;
  }
  return this;
}

Assistant:

AnnualTimeZoneRule&
AnnualTimeZoneRule::operator=(const AnnualTimeZoneRule& right) {
    if (this != &right) {
        TimeZoneRule::operator=(right);
        delete fDateTimeRule;
        fDateTimeRule = right.fDateTimeRule->clone();
        fStartYear = right.fStartYear;
        fEndYear = right.fEndYear;
    }
    return *this;
}